

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::blend_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t source_alpha)

{
  long y_00;
  ulong uVar1;
  ulong r;
  long lVar2;
  long lVar3;
  ulong g;
  ulong b;
  ssize_t x_00;
  long x_01;
  bool bVar4;
  uint64_t sg;
  uint64_t sr;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  ulong uVar5;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  ssize_t local_b8;
  ssize_t local_b0;
  ssize_t local_a8;
  ssize_t local_a0;
  ssize_t local_98;
  ssize_t local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  ssize_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  ssize_t local_38;
  
  local_b0 = w;
  if (w < 0) {
    local_b0 = source->width;
  }
  local_b8 = h;
  if (h < 0) {
    local_b8 = source->height;
  }
  local_a8 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_a8,&local_b0,&local_b8,&sx,&sy);
  local_88 = sx;
  local_90 = sy;
  local_98 = local_38;
  local_70 = 0;
  local_80 = local_b0;
  if (local_b0 < 1) {
    local_80 = local_70;
  }
  local_a0 = local_a8;
  local_78 = local_b8;
  if (local_b8 < 1) {
    local_78 = local_70;
  }
  do {
    if (local_70 == local_78) {
      return;
    }
    local_68 = local_90 + local_70;
    y_00 = local_a0 + local_70;
    lVar2 = local_80;
    x_00 = local_98;
    x_01 = local_88;
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      read_pixel(source,x_01,local_68,&local_c0,&local_c8,&local_d0,&local_40);
      uVar5 = this->max_value;
      uVar1 = (local_40 * source_alpha) / uVar5;
      r = local_c0;
      g = local_c8;
      b = local_d0;
      if (uVar1 == uVar5) {
LAB_00112821:
        write_pixel(this,x_00,y_00,r,g,b,uVar5);
      }
      else if (uVar5 <= local_40 * source_alpha) {
        read_pixel(this,x_00,y_00,&local_48,&local_50,&local_58,&local_60);
        uVar5 = this->max_value;
        lVar3 = uVar5 - uVar1;
        r = (local_48 * lVar3 + local_c0 * uVar1) / uVar5;
        g = (local_50 * lVar3 + local_c8 * uVar1) / uVar5;
        b = (lVar3 * local_58 + local_d0 * uVar1) / uVar5;
        uVar5 = local_60;
        goto LAB_00112821;
      }
      x_01 = x_01 + 1;
      x_00 = x_00 + 1;
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void Image::blend_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t source_alpha) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);

      uint64_t effective_alpha = (source_alpha * sa) / this->max_value;
      if (effective_alpha == this->max_value) {
        this->write_pixel(x + xx, y + yy, sr, sg, sb, effective_alpha);
      } else if (effective_alpha != 0x00) {
        uint64_t dr, dg, db, da;
        this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);
        this->write_pixel(x + xx, y + yy,
            (sr * effective_alpha + dr * (this->max_value - effective_alpha)) / this->max_value,
            (sg * effective_alpha + dg * (this->max_value - effective_alpha)) / this->max_value,
            (sb * effective_alpha + db * (this->max_value - effective_alpha)) / this->max_value,
            da);
      }
    }
  }
}